

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonparser.cpp
# Opt level: O1

bool json_parse(uint8_t *buf,size_t len,ParsedJson *pj,bool reallocifneeded)

{
  bool bVar1;
  ostream *poVar2;
  ulong uVar3;
  uint8_t *__dest;
  uint8_t *tmpbuf;
  bool bVar4;
  
  if (pj->bytecapacity < len) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Your ParsedJson cannot support documents that big: ",0x33);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
  }
  else {
    if (reallocifneeded) {
      uVar3 = sysconf(0x1e);
      if ((ulong)(buf + (len - 1)) % uVar3 < 0x20) {
        __dest = (uint8_t *)allocate_padded_buffer(len);
        bVar4 = __dest != (uint8_t *)0x0;
        bVar1 = bVar4;
        if (bVar4) {
          memcpy(__dest,buf,len);
        }
      }
      else {
        bVar4 = true;
        __dest = buf;
        bVar1 = false;
      }
      buf = __dest;
      if (!bVar4) {
        return false;
      }
    }
    else {
      bVar1 = false;
    }
    bVar4 = find_structural_bits(buf,len,pj);
    if (bVar4) {
      bVar4 = unified_machine(buf,len,pj);
      if ((bool)(buf != (uint8_t *)0x0 & bVar1)) {
        free(buf);
        return bVar4;
      }
      return bVar4;
    }
    if (buf != (uint8_t *)0x0 && bVar1) {
      free(buf);
    }
  }
  return false;
}

Assistant:

WARN_UNUSED
bool json_parse(const uint8_t *buf, size_t len, ParsedJson &pj, bool reallocifneeded) {
  if (pj.bytecapacity < len) {
    std::cerr << "Your ParsedJson cannot support documents that big: " << len
              << std::endl;
    return false;
  }
  bool reallocated = false;
  if(reallocifneeded) {
      // realloc is needed if the end of the memory crosses a page
#ifdef _MSC_VER
	  SYSTEM_INFO sysInfo; 
	  GetSystemInfo(&sysInfo); 
	  long pagesize = sysInfo.dwPageSize;
#else
     long pagesize = sysconf (_SC_PAGESIZE); 
#endif
	 if ( (reinterpret_cast<uintptr_t>(buf + len - 1) % pagesize ) < SIMDJSON_PADDING ) {
       const uint8_t *tmpbuf  = buf;
       buf = reinterpret_cast<uint8_t *>(allocate_padded_buffer(len));
       if(buf == nullptr) { return false;
}
       memcpy((void*)buf,tmpbuf,len);
       reallocated = true;
     }
  }
  bool isok = find_structural_bits(buf, len, pj);
  if (isok) {
    isok = unified_machine(buf, len, pj);
  } else {
    if(reallocated) { aligned_free((void*)buf);
}
    return false;
  }
  if(reallocated) { aligned_free((void*)buf);
}
  return isok;
}